

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall
CppGenerator::generateCode(CppGenerator *this,bool hasApplicationHandler,bool hasDynamicFunctions)

{
  size_t sVar1;
  size_t sVar2;
  size_t **ppsVar3;
  size_t *psVar4;
  size_t *psVar5;
  TDNode *pTVar6;
  View *pVVar7;
  long lVar8;
  size_t var;
  ulong uVar9;
  ulong uVar10;
  size_t rel;
  size_t rel_1;
  var_bitset nodeBag;
  string local_50;
  
  this->_hasApplicationHandler = hasApplicationHandler;
  this->_hasDynamicFunctions = hasDynamicFunctions;
  sVar1 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  sVar2 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  ppsVar3 = (size_t **)operator_new__(-(ulong)(sVar1 + sVar2 >> 0x3d != 0) | (sVar1 + sVar2) * 8);
  this->sortOrders = ppsVar3;
  sVar1 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar10 = sVar1 << 5;
  psVar4 = (size_t *)operator_new__(-(ulong)(sVar1 >> 0x3b != 0) | uVar10 | 8);
  *psVar4 = sVar1;
  if (sVar1 != 0) {
    psVar5 = psVar4 + 3;
    do {
      psVar5[-2] = (size_t)psVar5;
      psVar5[-1] = 0;
      *(undefined1 *)psVar5 = 0;
      psVar5 = psVar5 + 4;
      uVar10 = uVar10 - 0x20;
    } while (uVar10 != 0);
  }
  this->viewName = (string *)(psVar4 + 1);
  sVar1 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar10 = sVar1 * 8;
  if (0x1fffffffffffffff < sVar1) {
    uVar10 = 0xffffffffffffffff;
  }
  psVar4 = (size_t *)operator_new__(uVar10);
  this->viewLevelRegister = psVar4;
  uVar10 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar10) break;
    pTVar6 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar10);
    sVar1 = std::_Base_bitset<2UL>::_M_do_count(&(pTVar6->_bag).super__Base_bitset<2UL>);
    uVar9 = sVar1 * 8;
    if (0x1fffffffffffffff < sVar1) {
      uVar9 = 0xffffffffffffffff;
    }
    psVar4 = (size_t *)operator_new__(uVar9);
    memset(psVar4,0,uVar9);
    this->sortOrders[uVar10] = psVar4;
    uVar10 = uVar10 + 1;
  }
  lVar8 = 0;
  uVar10 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar1 <= uVar10) break;
    pVVar7 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,uVar10);
    sVar1 = std::_Base_bitset<2UL>::_M_do_count(&(pVVar7->_fVars).super__Base_bitset<2UL>);
    uVar9 = sVar1 * 8;
    if (0x1fffffffffffffff < sVar1) {
      uVar9 = 0xffffffffffffffff;
    }
    psVar4 = (size_t *)operator_new__(uVar9);
    memset(psVar4,0,uVar9);
    ppsVar3 = this->sortOrders;
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    ppsVar3[sVar1 + uVar10] = psVar4;
    std::__cxx11::to_string(&local_50,uVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodeBag,"V"
                   ,&local_50);
    std::__cxx11::string::operator=
              ((string *)((long)&(this->viewName->_M_dataplus)._M_p + lVar8),(string *)&nodeBag);
    std::__cxx11::string::~string((string *)&nodeBag);
    std::__cxx11::string::~string((string *)&local_50);
    uVar10 = uVar10 + 1;
    lVar8 = lVar8 + 0x20;
  }
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (&this->variableDependency,100);
  uVar10 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar10) break;
    pTVar6 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar10);
    nodeBag.super__Base_bitset<2UL>._M_w[0] = (pTVar6->_bag).super__Base_bitset<2UL>._M_w[0];
    nodeBag.super__Base_bitset<2UL>._M_w[1] = (pTVar6->_bag).super__Base_bitset<2UL>._M_w[1];
    lVar8 = 0;
    for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
      if ((nodeBag.super__Base_bitset<2UL>._M_w[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        std::_Base_bitset<2UL>::_M_do_or
                  ((_Base_bitset<2UL> *)
                   ((long)(((this->variableDependency).
                            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super__Base_bitset<2UL>).
                          _M_w + lVar8),&nodeBag.super__Base_bitset<2UL>);
      }
      lVar8 = lVar8 + 0x10;
    }
    uVar10 = uVar10 + 1;
  }
  ppsVar3 = this->sortOrders;
  pTVar6 = ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _root;
  lVar8 = 0;
  for (uVar10 = 0; uVar10 != 100; uVar10 = uVar10 + 1) {
    if (((pTVar6->_bag).super__Base_bitset<2UL>._M_w[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
      ppsVar3[pTVar6->_id][lVar8] = uVar10;
      lVar8 = lVar8 + 1;
    }
  }
  createRelationSortingOrder(this,pTVar6,&pTVar6->_id);
  createGroupVariableOrder(this);
  computeParallelizeGroup(this,(multifaq::cppgen::PARALLEL_TYPE & 0xfffffffe) == 2);
  genDataHandler(this);
  for (uVar10 = 0;
      uVar10 < (ulong)(((long)(this->viewGroups).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->viewGroups).
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar10 = uVar10 + 1
      ) {
    genComputeGroupFiles(this,uVar10);
  }
  genMainFunction(this,(multifaq::cppgen::PARALLEL_TYPE & 0xfffffffd) == 1);
  genMakeFile(this);
  return;
}

Assistant:

void CppGenerator::generateCode(bool hasApplicationHandler,
                                bool hasDynamicFunctions)
{
    DINFO("Start generate C++ code. \n");

    _hasApplicationHandler = hasApplicationHandler;
    _hasDynamicFunctions = hasDynamicFunctions;
    
    sortOrders = new size_t*[_td->numberOfRelations() + _qc->numberOfViews()];
    viewName = new std::string[_qc->numberOfViews()];
    viewLevelRegister  = new size_t[_qc->numberOfViews()];
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        sortOrders[rel] = new size_t[_td->getRelation(rel)->_bag.count()]();
    
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {   
        sortOrders[view + _td->numberOfRelations()] =
            new size_t[_qc->getView(view)->_fVars.count()]();
        viewName[view] = "V"+std::to_string(view);
    }
    
    variableDependency.resize(NUM_OF_VARIABLES);
    
    // Find all the dependencies amongst the variables
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
        var_bitset nodeBag = _td->getRelation(rel)->_bag;

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (nodeBag[var])
                variableDependency[var] |= nodeBag;
        }
    }
    
    // FIRST WE CREATE THE VARIABLE ORDER FOR EACH RELATION
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_td->_root->_bag[var])
        {
            sortOrders[_td->_root->_id][orderIdx] = var;
            ++orderIdx;
        }
    }
    
    createRelationSortingOrder(_td->_root, _td->_root->_id);
    
    createGroupVariableOrder();

    bool domainParallelism = PARALLEL_TYPE == DOMAIN_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    computeParallelizeGroup(domainParallelism);
    
    genDataHandler();
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
        genComputeGroupFiles(group);
    
    bool taskParallelism = PARALLEL_TYPE == TASK_PARALLELIZATION ||
        PARALLEL_TYPE == BOTH_PARALLELIZATION;

    genMainFunction(taskParallelism);
    
    genMakeFile();    
}